

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O2

void __thiscall
mnf::Manifold::applyDiffRetractation(Manifold *this,RefMat *out,ConstRefMat *in,ConstRefVec *x)

{
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  long local_30;
  
  mnf_assert((this->super_ValidManifold).flag_ == 0x677d7257);
  mnf_assert((in->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value == this->representationDim_);
  mnf_assert((out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value == this->tangentDim_);
  mnf_assert((in->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value ==
             (out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value);
  mnf_assert((x->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_rows.m_value == this->representationDim_);
  local_38 = (out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value;
  local_48 = *(undefined4 *)
              &(out->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
  uStack_44 = *(undefined4 *)
               ((long)&(out->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                       .
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_data + 4);
  uStack_40 = (undefined4)
              (out->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
  uStack_3c = *(undefined4 *)
               ((long)&(out->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                       .
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_rows.m_value + 4);
  local_30 = (out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
  (*this->_vptr_Manifold[0x17])(this,&local_48,in,x);
  return;
}

Assistant:

void Manifold::applyDiffRetractation(RefMat out, const ConstRefMat& in,
                                     const ConstRefVec& x) const
{
  mnf_assert(isValid() || seeMessageAbove());
  mnf_assert(in.cols() == representationDim_);
  mnf_assert(out.cols() == tangentDim_);
  mnf_assert(in.rows() == out.rows());
  mnf_assert(x.size() == representationDim_);
  applyDiffRetractation_(out, in, x);
}